

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPTrainClient.cpp
# Opt level: O1

int __thiscall
tiger::trains::client::TCPTrainClient::getCoordinate(TCPTrainClient *this,CoordsMap *coordsMap)

{
  Logger *this_00;
  int iVar1;
  ssize_t sVar2;
  ResposeMessage *pRVar3;
  Writer *pWVar4;
  string *psVar5;
  size_t in_RCX;
  void *__buf;
  uint32_t uVar6;
  int in_R8D;
  unique_ptr<tiger::trains::network::ResposeMessage,_std::default_delete<tiger::trains::network::ResposeMessage>_>
  message;
  char sendBuffer [1585769];
  ResposeMessage *local_c0;
  undefined8 local_b8;
  char local_b0 [24];
  Writer local_98;
  
  local_b8 = 0x100000000a;
  builtin_strncpy(local_b0,"{\n \"layer\": 10\n}",0x10);
  iVar1 = (int)&local_b8;
  sVar2 = network::TCPSession::send(&this->tcpSession,iVar1,(void *)0x18,in_RCX,in_R8D);
  uVar6 = 8;
  if ((char)sVar2 != '\0') {
    pRVar3 = (ResposeMessage *)
             network::TCPSession::recv(&this->tcpSession,iVar1,__buf,in_RCX,in_R8D);
    local_c0 = pRVar3;
    if ((pRVar3 == (ResposeMessage *)0x0) || (pRVar3->result != 0)) {
      uVar6 = pRVar3->result;
    }
    else {
      this_00 = this->logger;
      (**(this_00->super_ThreadSafe)._vptr_ThreadSafe)(this_00);
      el::Logger::log_<char[15],char*>
                (this_00,Info,0," %v\n %v",(char (*) [15])"Coordinate Map",&pRVar3->data);
      iVar1 = convertors::json::ModelConvertor::readCoordsMap
                        (&this->convertor,local_c0->data,(int)local_c0->dataLength,coordsMap);
      if (iVar1 == 0) {
        uVar6 = 0;
      }
      else {
        local_98._vptr_Writer = (_func_int **)&PTR__Writer_00183bb0;
        local_98.m_level = Error;
        local_98.m_file =
             "/workspace/llm4binary/github/license_all_cmakelists_25/BrychDaneel[P]WgForgeTrains/src/client/TCPTrainClient.cpp"
        ;
        local_98.m_line = 0xeb;
        local_98.m_func =
             "virtual int tiger::trains::client::TCPTrainClient::getCoordinate(models::CoordsMap *)"
        ;
        local_98.m_verboseLevel = 0;
        local_98.m_logger = (Logger *)0x0;
        local_98.m_proceed = false;
        local_98.m_messageBuilder.m_logger = (Logger *)0x0;
        local_98.m_messageBuilder.m_containerLogSeperator = "";
        local_98.m_dispatchAction = NormalLog;
        local_98.m_loggerIds.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_98.m_loggerIds.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_98.m_loggerIds.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pWVar4 = el::base::Writer::construct(&local_98,1,"default");
        psVar5 = convertors::json::ModelConvertor::getLastErrorMessage_abi_cxx11_(&this->convertor);
        if (pWVar4->m_proceed == true) {
          el::base::MessageBuilder::operator<<(&pWVar4->m_messageBuilder,(psVar5->_M_dataplus)._M_p)
          ;
        }
        el::base::Writer::~Writer(&local_98);
        uVar6 = 6;
      }
    }
    if (local_c0 != (ResposeMessage *)0x0) {
      std::default_delete<tiger::trains::network::ResposeMessage>::operator()
                ((default_delete<tiger::trains::network::ResposeMessage> *)&local_c0,local_c0);
    }
  }
  return uVar6;
}

Assistant:

int TCPTrainClient::getCoordinate(models::CoordsMap *coordsMap)
{
    char buffer[BUFF_SIZE] = "{\n \"layer\": 10\n}";
    size_t len = strlen(buffer);

    char sendBuffer[8+len];
    uint32_t cmd = 10;

    memcpy(sendBuffer, &cmd, OFFSET_SIZE);
    memcpy(sendBuffer + OFFSET_1, &len, OFFSET_SIZE);
    memcpy(sendBuffer + OFFSET_2, buffer, len);

    if (!tcpSession.send(sendBuffer, len + OFFSET_2))
        return (int)TCPTrainClient::ErrorType::NOT_SEND;


    std::unique_ptr<network::ResposeMessage> message(tcpSession.recv());

    if (message == nullptr || message->result != 0)
        return message->result;


    logger->info(" %v\n %v", "Coordinate Map", message->data);

    int retVal = convertor.readCoordsMap(message->data, message->dataLength, coordsMap);


    if (retVal != 0)
    {
        LOG(ERROR) << convertor.getLastErrorMessage();
        return (int)TCPTrainClient::ErrorType::JSON_NO_PARSE;
    }

    return (int)TCPTrainClient::ErrorType::OKEY;


}